

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_object.cpp
# Opt level: O0

void __thiscall
mjs::date_object::do_debug_print_extra
          (date_object *this,wostream *os,int param_2,int param_3,int indent)

{
  uint uVar1;
  size_type __n;
  wostream *pwVar2;
  allocator<wchar_t> local_69;
  wstring local_68 [32];
  char local_48 [8];
  char buffer [32];
  int indent_local;
  int param_3_local;
  int param_2_local;
  wostream *os_local;
  date_object *this_local;
  
  builtin_strncpy(local_48,"Invalid ",8);
  builtin_strncpy(buffer,"Date",5);
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer._28_4_ = indent;
  uVar1 = std::isnan(this->value_);
  if ((uVar1 & 1) == 0) {
    snprintf(local_48,0x20,"%.17g",this->value_);
  }
  __n = (size_type)(int)buffer._28_4_;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_68,__n,L' ',&local_69);
  pwVar2 = std::operator<<(os,local_68);
  pwVar2 = std::operator<<(pwVar2,"[[Value]]: ");
  pwVar2 = std::operator<<(pwVar2,local_48);
  std::operator<<(pwVar2,"\n");
  std::__cxx11::wstring::~wstring(local_68);
  std::allocator<wchar_t>::~allocator(&local_69);
  return;
}

Assistant:

void do_debug_print_extra(std::wostream& os, int, int, int indent) const override {
        char buffer[32] = "Invalid Date";
        if (!std::isnan(value_)) {
            std::snprintf(buffer, sizeof(buffer), "%.17g", value_);
        }
        os << std::wstring(indent, ' ') << "[[Value]]: " << buffer << "\n";
    }